

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::Setup::Setup
          (Setup *this,ScriptFunction *function,Arguments *args,bool bailedOut,bool inlinee,
          bool isGeneratorFrame)

{
  FunctionBody *pFVar1;
  bool isGeneratorFrame_local;
  bool inlinee_local;
  bool bailedOut_local;
  Arguments *args_local;
  ScriptFunction *function_local;
  Setup *this_local;
  
  this->inParams = args->Values;
  this->function = function;
  pFVar1 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this->executeFunction = pFVar1;
  this->inSlotsCount = SUB84(args->Info,0) & 0xffffff;
  this->callFlags =
       SUB84(args->Info,3) &
       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed|
        CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New);
  this->bailedOut = bailedOut;
  this->bailedOutOfInlinee = inlinee;
  this->isGeneratorFrame = isGeneratorFrame;
  SetupInternal(this);
  return;
}

Assistant:

InterpreterStackFrame::Setup::Setup(Js::ScriptFunction * function, Js::Arguments& args, bool bailedOut, bool inlinee, bool isGeneratorFrame)
        : function(function),
          inParams(args.Values),
          inSlotsCount(args.Info.Count),
          executeFunction(function->GetFunctionBody()),
          callFlags(args.Info.Flags),
          bailedOutOfInlinee(inlinee),
          bailedOut(bailedOut),
          isGeneratorFrame(isGeneratorFrame)
    {
        SetupInternal();
    }